

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.hpp
# Opt level: O0

void __thiscall
runtime::VirtualMachine::VirtualMachine
          (VirtualMachine *this,bool isDebug,ostream *out,istream *in,
          shared_ptr<const_bytecode::CompiledFile> *file)

{
  shared_ptr<const_bytecode::CompiledFile> *file_local;
  istream *in_local;
  ostream *out_local;
  bool isDebug_local;
  VirtualMachine *this_local;
  
  this->_vptr_VirtualMachine = (_func_int **)&PTR__VirtualMachine_001a3d58;
  std::shared_ptr<const_bytecode::CompiledFile>::shared_ptr(&this->file,file);
  std::shared_ptr<runtime::StackFrame>::shared_ptr(&this->stackFrame,(nullptr_t)0x0);
  Heap::Heap(&this->heap,this);
  this->out = out;
  this->in = in;
  this->isPanicing = false;
  this->isDebug = isDebug;
  return;
}

Assistant:

explicit VirtualMachine(
    bool isDebug,
    std::ostream & out,
    std::istream & in,
    std::shared_ptr<const bytecode::CompiledFile> file
  ) noexcept
  : file{std::move(file)}
  , stackFrame{nullptr}
  , heap{this}
  , out{out}
  , in{in}
  , isPanicing{false}
  , isDebug{isDebug}
  {}